

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::clauseAnd(SelectionCompiler *this)

{
  bool bVar1;
  int iVar2;
  Token tokenAnd;
  Token TStack_38;
  
  bVar1 = clauseNot(this);
  if (bVar1) {
    while( true ) {
      iVar2 = tokPeek(this);
      if (iVar2 != 0x403) break;
      tokenNext(&TStack_38,this);
      bVar1 = clauseNot(this);
      if (!bVar1) {
        std::any::reset(&TStack_38.value);
        goto LAB_002129e7;
      }
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                (&this->ltokenPostfix,&TStack_38);
      std::any::reset(&TStack_38.value);
    }
    bVar1 = true;
  }
  else {
LAB_002129e7:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SelectionCompiler::clauseAnd() {
    if (!clauseNot()) { return false; }

    while (tokPeek() == Token::opAnd) {
      Token tokenAnd = tokenNext();
      if (!clauseNot()) { return false; }
      addTokenToPostfix(tokenAnd);
    }
    return true;
  }